

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

void __thiscall HEkkDual::majorUpdateFactor(HEkkDual *this)

{
  int iVar1;
  HEkk *pHVar2;
  HighsInt *iRow;
  ulong uVar3;
  ulong uVar4;
  HVector_ptr *ppHVar5;
  long lVar6;
  
  iVar1 = this->multi_nFinish;
  lVar6 = (long)iVar1;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar3 = lVar6 * 4;
  }
  iRow = (HighsInt *)operator_new__(uVar3);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)(lVar6 - 1U)) {
    uVar4 = lVar6 - 1U & 0xffffffff;
  }
  ppHVar5 = &this->multi_finish[1].col_aq;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *(HVector_ptr *)((long)ppHVar5[-0x10] + 0x70) = ppHVar5[-1];
    *(HVector_ptr *)((long)ppHVar5[-0xf] + 0x70) = *ppHVar5;
    iRow[uVar3] = *(HighsInt *)(ppHVar5 + -0x17);
    ppHVar5 = ppHVar5 + 0xf;
  }
  iRow[lVar6 + -1] = this->multi_finish[lVar6 + -1].row_out;
  if (0 < iVar1) {
    HEkk::updateFactor(this->ekk_instance_,this->multi_finish[0].col_aq,this->multi_finish[0].row_ep
                       ,iRow,&this->rebuild_reason);
  }
  pHVar2 = this->ekk_instance_;
  if ((pHVar2->build_synthetic_tick_ <= pHVar2->total_synthetic_tick_) &&
     (0x31 < (pHVar2->info_).update_count)) {
    this->rebuild_reason = 2;
  }
  operator_delete__(iRow);
  return;
}

Assistant:

void HEkkDual::majorUpdateFactor() {
  /**
   * 9. Update the factor by CFT
   */
  HighsInt* iRows = new HighsInt[multi_nFinish];
  for (HighsInt iCh = 0; iCh < multi_nFinish - 1; iCh++) {
    multi_finish[iCh].row_ep->next = multi_finish[iCh + 1].row_ep;
    multi_finish[iCh].col_aq->next = multi_finish[iCh + 1].col_aq;
    iRows[iCh] = multi_finish[iCh].row_out;
  }
  iRows[multi_nFinish - 1] = multi_finish[multi_nFinish - 1].row_out;
  if (multi_nFinish > 0)
    ekk_instance_.updateFactor(multi_finish[0].col_aq, multi_finish[0].row_ep,
                               iRows, &rebuild_reason);

  // Determine whether to reinvert based on the synthetic clock
  const double use_build_synthetic_tick =
      ekk_instance_.build_synthetic_tick_ * kMultiBuildSyntheticTickMu;
  const bool reinvert_syntheticClock =
      ekk_instance_.total_synthetic_tick_ >= use_build_synthetic_tick;
  const bool performed_min_updates =
      ekk_instance_.info_.update_count >=
      kMultiSyntheticTickReinversionMinUpdateCount;
  if (reinvert_syntheticClock && performed_min_updates)
    rebuild_reason = kRebuildReasonSyntheticClockSaysInvert;

  delete[] iRows;
}